

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

void __thiscall Expr_i_Test::TestBody(Expr_i_Test *this)

{
  char *pcVar1;
  double in_XMM1_Qa;
  ExprPtr EVar2;
  ExprPtr expr;
  AssertHelper in_stack_ffffffffffffffa8;
  internal in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  Message local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  ExprPtr local_18;
  
  EVar2 = mathiu::impl::operator*
                    ((impl *)&local_18,(ExprPtr *)mathiu::impl::i,(ExprPtr *)mathiu::impl::i);
  mathiu::impl::toString_abi_cxx11_
            ((string *)&local_40,(impl *)&local_18,
             (ExprPtr *)
             EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[8]>
            ((internal *)&stack0xffffffffffffffb0,"toString(expr)","\"(^ i 2)\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,
             (char (*) [8])"(^ i 2)");
  if ((undefined1 *)
      CONCAT71(local_40.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._1_7_,
               (char)local_40.ss_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl) != &stack0xffffffffffffffd0) {
    operator_delete((undefined1 *)
                    CONCAT71(local_40.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             (char)local_40.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl),in_stack_ffffffffffffffd0 + 1);
  }
  if (in_stack_ffffffffffffffb0 == (internal)0x0) {
    testing::Message::Message(&local_40);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/expr.cpp"
               ,0x2c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffffa8,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
    if ((long *)CONCAT71(local_40.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         (char)local_40.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_40.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     (char)local_40.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  mathiu::impl::evalc(&local_18);
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
             (char *)in_stack_ffffffffffffffa8.data_,(char *)0x1303a2,in_XMM1_Qa,
             (double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0);
  if ((char)local_40.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffb0);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/expr.cpp"
               ,0x2e,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa8,(Message *)&stack0xffffffffffffffb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
    if ((long *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0) + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
             (char *)in_stack_ffffffffffffffa8.data_,(char *)0x13044b,in_XMM1_Qa,
             (double)in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0);
  if ((char)local_40.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffb0);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/expr.cpp"
               ,0x2f,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa8,(Message *)&stack0xffffffffffffffb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
    if ((long *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0) + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  if (local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(Expr, i)
{
    auto expr = i * i;
    EXPECT_EQ(toString(expr), "(^ i 2)");
    auto result = evalc(expr);
    EXPECT_NEAR(result.real(), -1, 1e-5);
    EXPECT_NEAR(result.imag(), 0, 1e-5);
}